

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O0

void QInputDevicePrivate::unregisterDevice(QInputDevice *dev)

{
  long lVar1;
  bool bVar2;
  QDebug *o;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QMutexLocker<QBasicMutex> lock;
  QLoggingCategory *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QDebug in_stack_ffffffffffffffb8;
  QDebug local_40;
  QDebug local_38 [2];
  QInputDevice *device;
  QDebug *debug;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::
          isDestroyed((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                       *)0x39bbc7);
  if (!bVar2) {
    t = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QBasicMutex *)in_stack_ffffffffffffff98);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_> *)
               in_stack_ffffffffffffff98);
    QList<QInputDevice_const*>::removeOne<QInputDevice_const*>
              ((QList<const_QInputDevice_*> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QInputDevice **)in_stack_ffffffffffffff98);
    device = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
    debug = (QDebug *)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaInputDevices();
    anon_unknown.dwarf_4edfe4::QLoggingCategoryMacroHolder<(QtMsgType)4>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8), bVar2) {
      anon_unknown.dwarf_4edfe4::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x39bc5b);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 (char *)in_stack_ffffffffffffff98,(char *)0x39bc6f);
      QMessageLogger::info();
      o = QDebug::operator<<((QDebug *)in_stack_ffffffffffffffb8.stream,t);
      QDebug::QDebug(&local_40,o);
      ::operator<<(debug,device);
      QDebug::~QDebug(local_38);
      QDebug::~QDebug(&local_40);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffb8);
      debug = (QDebug *)((ulong)debug & 0xffffffffffffff00);
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDevicePrivate::unregisterDevice(const QInputDevice *dev)
{
    if (deviceList.isDestroyed())
        return;     // nothing to remove!

    QMutexLocker lock(&devicesMutex);
    deviceList()->removeOne(dev);
    qCInfo(lcQpaInputDevices) << "Unregistered" << dev;
}